

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  LodePNGColorMode *mode_in;
  LodePNGColorType LVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_t sVar4;
  char **ppcVar5;
  char **ppcVar6;
  uint uVar7;
  int iVar8;
  uchar *out_00;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  ucvector outv;
  uchar *data;
  size_t datasize;
  LodePNGInfo info;
  ucvector local_168;
  LodePNGEncoderSettings *local_148;
  uchar *local_140;
  size_t local_138;
  char **local_130;
  char **local_128;
  size_t *local_120;
  LodePNGInfo local_118;
  
  local_140 = (uchar *)0x0;
  local_138 = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  LVar1 = (state->info_png).color.colortype;
  if (((LVar1 == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     ((state->info_png).color.palettesize - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    return 0x44;
  }
  if (2 < (state->encoder).zlibsettings.btype) {
    state->error = 0x3d;
    return 0x3d;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    return 0x47;
  }
  uVar7 = checkColorValidity(LVar1,(state->info_png).color.bitdepth);
  state->error = uVar7;
  if (uVar7 != 0) {
    return uVar7;
  }
  uVar7 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar7;
  if (uVar7 != 0) {
    return uVar7;
  }
  mode_in = &state->info_raw;
  local_118.color.key_defined = 0;
  local_118.color.key_r = 0;
  local_118.color.key_g = 0;
  local_118.color.key_b = 0;
  local_118.color.colortype = LCT_RGBA;
  local_118.color.bitdepth = 8;
  local_118.color.palette = (uchar *)0x0;
  local_118.color.palettesize = 0;
  local_118.interlace_method = 0;
  local_118.compression_method = 0;
  local_118.filter_method = 0;
  local_118.phys_defined = 0;
  local_118.unknown_chunks_data[0] = (uchar *)0x0;
  local_118.unknown_chunks_data[1] = (uchar *)0x0;
  local_118.unknown_chunks_data[2] = (uchar *)0x0;
  local_118.unknown_chunks_size[0] = 0;
  local_118.unknown_chunks_size[1] = 0;
  local_118.unknown_chunks_size[2] = 0;
  local_118.background_defined = 0;
  local_118.background_r = 0;
  local_118.background_g = 0;
  local_118.background_b = 0;
  local_118.text_num = 0;
  local_118.text_keys = (char **)0x0;
  local_118.text_strings = (char **)0x0;
  local_118.itext_num = 0;
  local_118.itext_keys = (char **)0x0;
  local_118.itext_langtags = (char **)0x0;
  local_118.itext_transkeys = (char **)0x0;
  local_118.itext_strings = (char **)0x0;
  local_118.time_defined = 0;
  local_120 = outsize;
  lodepng_info_copy(&local_118,&state->info_png);
  if ((state->encoder).auto_convert == 0) {
    uVar7 = state->error;
  }
  else {
    uVar7 = lodepng_auto_choose_color(&local_118.color,image,w,h,mode_in);
    state->error = uVar7;
  }
  local_148 = &state->encoder;
  if (uVar7 == 0) {
    iVar8 = lodepng_color_mode_equal(mode_in,&local_118.color);
    if (iVar8 == 0) {
      iVar8 = 0;
      if ((local_118.color._0_8_ & 0xffffffff) < 7) {
        iVar8 = *(int *)(&DAT_00114d94 + (local_118.color._0_8_ & 0xffffffff) * 4);
      }
      lVar11 = (ulong)(iVar8 * local_118.color.bitdepth) * (ulong)(h * w);
      out_00 = (uchar *)malloc(lVar11 + 7U >> 3);
      if (lVar11 == 0 || out_00 != (uchar *)0x0) {
        uVar7 = lodepng_convert(out_00,image,&local_118.color,mode_in,w,h);
        state->error = uVar7;
        if (uVar7 == 0) {
          preProcessScanlines(&local_140,&local_138,out_00,w,h,&local_118,local_148);
        }
      }
      else {
        state->error = 0x53;
      }
      free(out_00);
    }
    else {
      preProcessScanlines(&local_140,&local_138,image,w,h,&local_118,local_148);
    }
  }
  local_168.data = (uchar *)0x0;
  local_168.size = 0;
  local_168.allocsize = 0;
  if (state->error != 0) goto LAB_0010e9d2;
  writeSignature(&local_168);
  uVar3 = local_118.color._0_8_;
  LVar1 = local_118.color.colortype;
  addChunk_IHDR(&local_168,w,h,local_118.color.colortype,local_118.color.bitdepth,
                local_118.interlace_method);
  if (local_118.unknown_chunks_data[0] != (uchar *)0x0) {
    uVar7 = addUnknownChunks(&local_168,local_118.unknown_chunks_data[0],
                             local_118.unknown_chunks_size[0]);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_0010e9d2;
  }
  if (LVar1 == LCT_PALETTE) {
    addChunk_PLTE(&local_168,&local_118.color);
    uVar7 = getPaletteTranslucency(local_118.color.palette,local_118.color.palettesize);
joined_r0x0010ead3:
    if (uVar7 != 0) {
      addChunk_tRNS(&local_168,&local_118.color);
    }
  }
  else {
    if (((LVar1 & ~LCT_GREY_ALPHA) == LCT_RGB) && ((state->encoder).force_palette != 0)) {
      addChunk_PLTE(&local_168,&local_118.color);
    }
    if ((uVar3 & 0xfffffffd) == 0) {
      uVar7 = local_118.color.key_defined;
      goto joined_r0x0010ead3;
    }
  }
  if (local_118.background_defined != 0) {
    addChunk_bKGD(&local_168,&local_118);
  }
  if (local_118.phys_defined != 0) {
    addChunk_pHYs(&local_168,&local_118);
  }
  if (local_118.unknown_chunks_data[1] != (uchar *)0x0) {
    uVar7 = addUnknownChunks(&local_168,local_118.unknown_chunks_data[1],
                             local_118.unknown_chunks_size[1]);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_0010e9d2;
  }
  uVar7 = addChunk_IDAT(&local_168,local_140,local_138,&local_148->zlibsettings);
  state->error = uVar7;
  if (uVar7 != 0) goto LAB_0010e9d2;
  if (local_118.time_defined != 0) {
    addChunk_tIME(&local_168,&local_118.time);
  }
  ppcVar6 = local_118.text_strings;
  ppcVar5 = local_118.text_keys;
  sVar4 = local_118.text_num;
  if (local_118.text_num == 0) {
    if ((state->encoder).add_id != 0) goto LAB_0010ec49;
  }
  else {
    sVar10 = 0;
    do {
      pcVar2 = ppcVar5[sVar10];
      sVar9 = strlen(pcVar2);
      if (0x4f < sVar9) {
        uVar7 = 0x42;
LAB_0010ec0b:
        state->error = uVar7;
        break;
      }
      if (sVar9 == 0) {
        uVar7 = 0x43;
        goto LAB_0010ec0b;
      }
      if ((state->encoder).text_compression == 0) {
        addChunk_tEXt(&local_168,pcVar2,ppcVar6[sVar10]);
      }
      else {
        addChunk_zTXt(&local_168,pcVar2,ppcVar6[sVar10],&local_148->zlibsettings);
      }
      sVar10 = sVar10 + 1;
    } while (sVar4 != sVar10);
    ppcVar5 = local_118.text_keys;
    if ((state->encoder).add_id != 0) {
      if (sVar4 != 0) {
        sVar10 = 0;
        do {
          iVar8 = strcmp(ppcVar5[sVar10],"LodePNG");
          if (iVar8 == 0) goto LAB_0010ec61;
          sVar10 = sVar10 + 1;
        } while (sVar4 != sVar10);
      }
LAB_0010ec49:
      addChunk_tEXt(&local_168,"LodePNG",LODEPNG_VERSION_STRING);
    }
  }
LAB_0010ec61:
  ppcVar6 = local_118.itext_langtags;
  ppcVar5 = local_118.itext_keys;
  sVar4 = local_118.itext_num;
  if (local_118.itext_num != 0) {
    local_128 = local_118.itext_transkeys;
    local_130 = local_118.itext_strings;
    sVar10 = 0;
    do {
      pcVar2 = ppcVar5[sVar10];
      sVar9 = strlen(pcVar2);
      if (0x4f < sVar9) {
        uVar7 = 0x42;
LAB_0010ed08:
        state->error = uVar7;
        break;
      }
      if (sVar9 == 0) {
        uVar7 = 0x43;
        goto LAB_0010ed08;
      }
      addChunk_iTXt(&local_168,(state->encoder).text_compression,pcVar2,ppcVar6[sVar10],
                    local_128[sVar10],local_130[sVar10],&local_148->zlibsettings);
      sVar10 = sVar10 + 1;
    } while (sVar4 != sVar10);
  }
  if (local_118.unknown_chunks_data[2] != (uchar *)0x0) {
    uVar7 = addUnknownChunks(&local_168,local_118.unknown_chunks_data[2],
                             local_118.unknown_chunks_size[2]);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_0010e9d2;
  }
  lodepng_chunk_create(&local_168.data,&local_168.size,0,"IEND",(uchar *)0x0);
LAB_0010e9d2:
  lodepng_info_cleanup(&local_118);
  free(local_140);
  *out = local_168.data;
  *local_120 = local_168.size;
  return state->error;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  /*check input values validity*/
  if((state->info_png.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (state->info_png.color.palettesize == 0 || state->info_png.color.palettesize > 256))
  {
    CERROR_RETURN_ERROR(state->error, 68); /*invalid palette size, it is only allowed to be 1-256*/
  }
  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }
  state->error = checkColorValidity(state->info_png.color.colortype, state->info_png.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  /* color convert and compute scanline filter types */
  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);
  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if (!state->error)
  {
    if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
    {
      unsigned char* converted;
      size_t size = (w * h * (size_t)lodepng_get_bpp(&info.color) + 7) / 8;

      converted = (unsigned char*)lodepng_malloc(size);
      if(!converted && size) state->error = 83; /*alloc fail*/
      if(!state->error)
      {
        state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
      }
      if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
      lodepng_free(converted);
    }
    else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);
  }

  /* output all PNG chunks */
  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}